

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine_fixed16.c
# Opt level: O2

rt_function_error_t exec_affine_fixed16(rt_function_t *f)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  void *__s;
  byte bVar8;
  byte bVar9;
  long lVar10;
  short sVar11;
  int i;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  short *psVar18;
  int iVar19;
  int bpos;
  short *psVar20;
  int16_t *acc;
  short *local_58;
  
  plVar5 = *f->local_context;
  if (plVar5[6] == 0) {
    local_58 = (short *)0x0;
  }
  else {
    local_58 = *(short **)(plVar5[6] + 0x18);
  }
  bVar1 = *(byte *)(*plVar5 + 0x10);
  bVar2 = *(byte *)(plVar5[2] + 0x10);
  bVar8 = *(byte *)(plVar5[8] + 0x10) >> 4;
  lVar6 = *(long *)(*plVar5 + 0x18);
  lVar7 = *(long *)(plVar5[2] + 0x18);
  __s = *(void **)(plVar5[8] + 0x18);
  lVar17 = plVar5[4];
  if (lVar17 != 0) {
    bVar9 = *(byte *)(lVar17 + 0x10) >> 4;
    if (bVar8 < bVar9) {
      lVar17 = *(long *)(lVar17 + 0x18);
      uVar16 = *(uint *)(plVar5 + 0xd);
      for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        *(short *)(lVar17 + uVar13 * 2) =
             (short)((int)*(short *)(lVar17 + uVar13 * 2) / (1 << (bVar9 - bVar8 & 0x1f)));
      }
    }
    else if (bVar9 < bVar8) {
      puts(
          "OUTPUT variable has less range bits than BIAS variable. Please make sure affine/b has same or less range bits than Output to avoid overflow."
          );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  memset(__s,0,(long)(int)plVar5[9] * 2);
  for (iVar12 = 0; iVar12 < (int)plVar5[0xc]; iVar12 = iVar12 + 1) {
    uVar16 = *(uint *)(plVar5 + 0xd);
    iVar4 = *(int *)((long)plVar5 + 100);
    psVar18 = (short *)((long)__s + (long)(int)(uVar16 * iVar12) * 2);
    iVar19 = 0;
    if (0 < iVar4) {
      iVar19 = iVar4;
    }
    uVar13 = 0;
    if (0 < (int)uVar16) {
      uVar13 = (ulong)uVar16;
    }
    lVar17 = lVar7;
    psVar20 = local_58;
    for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
      lVar10 = 0;
      for (lVar14 = 0; iVar19 != (int)lVar14; lVar14 = lVar14 + 1) {
        lVar10 = lVar10 + (long)*(short *)(lVar17 + lVar14 * 2) *
                          (long)*(short *)(lVar6 + (long)(iVar4 * iVar12) * 2 + lVar14 * 2);
      }
      lVar10 = lVar10 / (long)(ulong)(uint)(1 << (((bVar2 >> 4) + (bVar1 >> 4)) - bVar8 & 0x1f));
      sVar11 = (short)lVar10;
      if (lVar10 < -0x7fff) {
        sVar11 = -0x8000;
      }
      if (0x7ffe < lVar10) {
        sVar11 = 0x7fff;
      }
      *psVar18 = sVar11;
      if (local_58 != (short *)0x0) {
        sVar3 = *psVar20;
        psVar20 = psVar20 + 1;
        *psVar18 = (short)(((int)sVar3 * (int)sVar11) / (1 << (*(byte *)(plVar5[6] + 0x10) >> 4)));
      }
      psVar18 = psVar18 + 1;
      lVar17 = lVar17 + (long)iVar4 * 2;
    }
    if (plVar5[4] != 0) {
      lVar17 = *(long *)(plVar5[4] + 0x18);
      acc = (int16_t *)((long)__s + (long)(int)(uVar16 * iVar12) * 2);
      for (lVar10 = 0; lVar10 < (int)uVar16; lVar10 = lVar10 + 1) {
        sum_acc_sat16(acc,*(int16_t *)(lVar17 + lVar10 * 2));
        uVar16 = *(uint *)(plVar5 + 0xd);
        acc = acc + 1;
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_affine_fixed16(rt_function_t *f) {
  affine_private_t *p =
      (affine_private_t *)(((affine_local_context_t *)(f->local_context))
                               ->data);
  int i, j, k; // Iterators.

  int16_t *input = (int16_t *)(p->input->data);
  int16_t *weight = (int16_t *)(p->weight->data);
  int16_t *output = (int16_t *)(p->output->data);
  int16_t *alpha = 0;

  const unsigned nbits_rescale =
      p->input->fp_pos + p->weight->fp_pos - p->output->fp_pos;

  if (p->alpha) {
    alpha = (int16_t *)p->alpha->data;
  }

  // If bias has less range bits (=more precision bits) than output, rescale
  // bias.
  // Otherwise, output has too few range bits. Change format before starting
  // computations.
  if (p->bias) {
    const unsigned int b_fp = p->bias->fp_pos;
    const unsigned int out_fp = p->output->fp_pos;
    const unsigned bias_size = p->output_loop_size;
    int16_t *bias = (int16_t *)(p->bias->data);

    if (b_fp > out_fp) {
      int i;
      for (i = 0; i < bias_size; i++) {
        *(bias + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure affine/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  // Clear output
  memset(output, 0, sizeof(int16_t) * p->output_size);

  for (k = 0; k < p->base_loop_size; k++) {
    int output_offset = k * p->output_loop_size;
    int input_offset = k * p->input_loop_size;
    int16_t *o_addr = output + output_offset;
    int16_t *alpha_addr = alpha;

    for (j = 0; j < p->output_loop_size; ++j) {
      int weight_offset = j * p->input_loop_size;

      int16_t *i_addr = input + input_offset;
      int16_t *w_addr = weight + weight_offset;
      int64_t sum = 0;

      for (i = 0; i < p->input_loop_size; ++i) {
        sum += (*i_addr++) * (*w_addr++);
      }
      // Rescale output to desired # of precision bits
      *o_addr = saturate64_to_16(sum / (1 << nbits_rescale));

      if (alpha) {
        *o_addr = (((int32_t)(*o_addr) * (int32_t)(*alpha_addr++))) /
                  (1 << p->alpha->fp_pos);
      }
      ++o_addr;
    }

    // Bias
    if (p->bias) {
      int16_t *bias = (int16_t *)(p->bias->data);
      for (i = 0; i < p->output_loop_size; i++) {
        int opos = output_offset + i;
        int bpos = i;
        sum_acc_sat16(output + opos, *(bias + bpos));
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}